

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualActionIndices
          (TransitionObservationIndependentMADPDiscrete *this)

{
  Scope *in_stack_00000038;
  Index in_stack_00000044;
  TransitionObservationIndependentMADPDiscrete *in_stack_00000048;
  
  JointToIndividualActionIndices(in_stack_00000048,in_stack_00000044,in_stack_00000038);
  return;
}

Assistant:

std::vector<Index> JointToIndividualActionIndices(
        Index ja_e, const Scope& agSC) const
        { 
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            std::vector<Index> ja_e_vec = IndexTools::JointToIndividualIndices(ja_e, nr_A_e);
            return(ja_e_vec);
        }